

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

void AlphaVectorPlanning::ExportValueFunction
               (string *filename,ValueFunctionPOMDPDiscrete *V,bool includeBGindices)

{
  byte bVar1;
  char *pcVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  BGPolicyIndex BVar6;
  reference pvVar7;
  void *this;
  byte in_DL;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RSI;
  string *in_RDI;
  int s;
  int nrS;
  uint i;
  int maxPrecision;
  ofstream fp;
  vector<double,_std::allocator<double>_> values;
  undefined4 in_stack_fffffffffffffd80;
  Index in_stack_fffffffffffffd84;
  int local_24c;
  uint local_244;
  long local_230 [7];
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe08;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe10;
  vector<double,_std::allocator<double>_> local_30;
  byte local_11;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *local_10;
  string *local_8;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x90b67f);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_230,pcVar2,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)local_230 + *(long *)(local_230[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "AlphaVectorPlanning::ExportValueFunction: failed to ");
    poVar5 = std::operator<<(poVar5,"open file ");
    poVar5 = std::operator<<(poVar5,local_8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::ios_base::precision((ios_base *)((long)local_230 + *(long *)(local_230[0] + -0x18)),0x11);
  for (local_244 = 0; sVar3 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(local_10)
      , local_244 != sVar3; local_244 = local_244 + 1) {
    pvVar4 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[]
                       (local_10,(ulong)local_244);
    AlphaVector::GetValues(pvVar4);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_30);
    pvVar4 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[]
                       (local_10,(ulong)local_244);
    in_stack_fffffffffffffd84 = AlphaVector::GetAction(pvVar4);
    std::ostream::operator<<(local_230,in_stack_fffffffffffffd84);
    if ((local_11 & 1) != 0) {
      poVar5 = std::operator<<((ostream *)local_230," ");
      pvVar4 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[]
                         (local_10,(ulong)local_244);
      BVar6 = AlphaVector::GetBetaI(pvVar4);
      std::ostream::operator<<(poVar5,BVar6);
    }
    std::ostream::operator<<(local_230,std::endl<char,std::char_traits<char>>);
    for (local_24c = 0; local_24c != (int)sVar3; local_24c = local_24c + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,(long)local_24c);
      std::ostream::operator<<(local_230,*pvVar7);
      if (local_24c < (int)sVar3 + -1) {
        std::operator<<((ostream *)local_230," ");
      }
    }
    this = (void *)std::ostream::operator<<(local_230,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::~ofstream(local_230);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  return;
}

Assistant:

void
AlphaVectorPlanning::ExportValueFunction(const string & filename,
                                         const ValueFunctionPOMDPDiscrete &V,
                                         bool includeBGindices)
{
    vector<double> values;

    ofstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "AlphaVectorPlanning::ExportValueFunction: failed to "
             << "open file " << filename << endl;            
    }

    // floating point precision must be digits10 + 2, to ensure that conversions are correct
    int maxPrecision = numeric_limits<double>::digits10 + 2;
    fp.precision(maxPrecision);

    for(unsigned int i=0;i!=V.size();i++)
    {
        values=V[i].GetValues();
        int nrS=values.size();

        fp << V[i].GetAction();
        // this breaks compatability with Cassandra's software
        if(includeBGindices)
            fp << " " << V[i].GetBetaI();
        fp << endl;

        for(int s=0;s!=nrS;s++)
        {
            fp << values[s];
            if(s<(nrS-1))
                fp << " ";
        }
        fp << endl << endl;
    }
}